

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.hpp
# Opt level: O2

void __thiscall
ranger::bhvr_tree::
sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,handler_type *hdl)

{
  _Function_base _Stack_78;
  anon_class_56_4_3ec9ec79 local_58;
  
  if (node != (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               *)0x0) {
    local_58.ap = ap;
    std::function<void_(bool,_test_agent_*)>::function(&local_58.hdl,hdl);
    local_58.this = this;
    local_58.node = node;
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              ((function<void(bool,test_agent*)> *)&_Stack_78,&local_58);
    (*node->_vptr_abstract_node[2])(node,ap,&_Stack_78);
    std::_Function_base::~_Function_base(&_Stack_78);
    std::_Function_base::~_Function_base(&local_58.hdl.super__Function_base);
    return;
  }
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  ::operator()(ap,hdl,true);
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 typename AgentProxy::handler_type hdl) const {
    if (node) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        if (!result) {
          ap(hdl, false);
        } else {
          exec_impl(ap, node->get_next_sibling(), std::move(hdl));
        }
      });
    } else {
      ap(hdl, true);
    }
  }